

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

iterator __thiscall
tf::SmallVectorImpl<tf::Node*>::insert<tf::Node**>
          (SmallVectorImpl<tf::Node*> *this,iterator I,Node **From,Node **To)

{
  move_iterator<tf::Node_**> in_end;
  long lVar1;
  iterator ppNVar2;
  Node **__src;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  size_t __n_00;
  bool bVar5;
  
  lVar1 = *(long *)this;
  if (*(iterator *)(this + 8) == I) {
    append<tf::Node**>(this,From,To);
    __src = (Node **)((long)I + (*(long *)this - lVar1));
  }
  else {
    __n_00 = (long)To - (long)From;
    uVar3 = (long)__n_00 >> 3;
    SmallVectorImpl<tf::Node_*>::reserve
              ((SmallVectorImpl<tf::Node_*> *)this,
               ((long)*(iterator *)(this + 8) - lVar1 >> 3) + uVar3);
    __src = (Node **)((long)I + (*(long *)this - lVar1));
    in_end._M_current = *(Node ***)(this + 8);
    uVar4 = (long)in_end._M_current - (long)__src >> 3;
    if (uVar4 < uVar3) {
      *(size_t *)(this + 8) = (long)in_end._M_current + __n_00;
      if (__src != in_end._M_current) {
        memcpy((void *)((long)in_end._M_current + __n_00 + uVar4 * -8),__src,
               (long)in_end._M_current - (long)__src);
      }
      lVar1 = 0;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        *(undefined8 *)((long)__src + lVar1) = *(undefined8 *)((long)From + lVar1);
        lVar1 = lVar1 + 8;
      }
      if ((Node **)((long)From + lVar1) != To) {
        memcpy(in_end._M_current,(Node **)((long)From + lVar1),__n_00 - lVar1);
      }
    }
    else {
      append<std::move_iterator<tf::Node**>>
                (this,(move_iterator<tf::Node_**>)(in_end._M_current + -uVar3),in_end);
      __n = (long)(in_end._M_current + -uVar3) - (long)__src;
      if (__n != 0) {
        memmove((void *)((long)in_end._M_current - __n),__src,__n);
      }
      if (To != From) {
        ppNVar2 = (iterator)memmove(__src,From,__n_00);
        return ppNVar2;
      }
    }
  }
  return __src;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    //assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    //assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->setEnd(this->end() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }